

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_UnknownSize2_Test::RangeMapTest_UnknownSize2_Test
          (RangeMapTest_UnknownSize2_Test *this)

{
  RangeMapTest *in_RDI;
  
  RangeMapTest::RangeMapTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__RangeMapTest_UnknownSize2_Test_00914cf0;
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize2) {
  // This case is slightly weird, but we do consider the "100" below to be a
  // hard fact even if the size is unknown, so the "[95, 105]: bar" range
  // doesn't override it.
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(95, 10, "bar");
  AssertMainMapEquals({
    {95, 100, kNoTranslation, "bar"},
    {100, 105, kNoTranslation, "foo"},
  });
}